

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

void slang::ast::Lookup::unqualifiedImpl
               (Scope *scope,string_view name,LookupLocation location,
               optional<slang::SourceRange> sourceRange,bitmask<slang::ast::LookupFlags> flags,
               SymbolIndex outOfBlockIndex,LookupResult *result)

{
  SymbolKind SVar1;
  uint uVar2;
  sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  *this;
  SourceLocation SVar3;
  WildcardImportSymbol *this_00;
  SourceRange range;
  SourceRange range_00;
  SourceRange range_01;
  optional<slang::SourceRange> sourceRange_00;
  string_view arg;
  string_view lookupName;
  string_view arg_00;
  string_view arg_01;
  string_view name_00;
  bool bVar4;
  ulong uVar5;
  int iVar6;
  iterator iVar7;
  Type *pTVar8;
  Scope *pSVar9;
  SubroutineSymbol *pSVar10;
  DeclaredType *pDVar11;
  Diagnostic *pDVar12;
  PackageSymbol *pPVar13;
  long *__dest;
  Symbol *pSVar14;
  SourceLocation SVar15;
  size_t __n;
  SymbolIndex SVar16;
  long *plVar17;
  long *__dest_00;
  long lVar18;
  long lVar19;
  SymbolIndex outOfBlockIndex_00;
  MethodPrototypeSymbol *this_01;
  ulong capacity;
  bool bVar20;
  bool bVar21;
  span<const_slang::ast::WildcardImportSymbol_*const,_18446744073709551615UL> sVar22;
  pair<ska::detailv3::sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>::templated_iterator<const_slang::ast::Symbol_*>,_bool>
  pVar23;
  LookupLocation location_00;
  Symbol *imported;
  SmallVector<Import,_4UL> imports;
  anon_class_32_4_2e62d3a1 reportRecursiveError;
  SmallSet<const_slang::ast::Symbol_*,_2UL,_ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
  importDedup;
  string_view local_138;
  bitmask<slang::ast::LookupFlags> local_124;
  Scope *local_120;
  MethodPrototypeSymbol *local_118;
  Symbol *local_110;
  long *local_108;
  ulong local_100;
  size_t local_f8;
  long local_f0 [8];
  Symbol *local_b0;
  pointer local_a8;
  anon_class_32_4_2e62d3a1 local_a0;
  StackAllocStorage<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL> local_80;
  sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
  local_58;
  
  SVar15 = (SourceLocation)location.scope;
  local_138._M_str = name._M_str;
  local_138._M_len = name._M_len;
  local_a0.sourceRange = &sourceRange;
  local_a0.name = &local_138;
  local_a0.result = result;
  local_124.m_bits = flags.m_bits;
  local_a0.scope = scope;
  if (scope->deferredMemberIndex != Invalid) {
    Scope::elaborate(scope);
  }
  SVar16 = location.index;
  this = &scope->nameMap->
          super_sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
  ;
  iVar7 = ska::detailv3::
          sherwood_v3_table<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::basic_string_view<char,_std::char_traits<char>_>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueHasher<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_slang::Hasher<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_ska::detailv3::KeyOrValueEquality<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>,_std::allocator<ska::detailv3::sherwood_v3_entry<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Symbol_*>_>_>_>
          ::find(this,&local_138);
  if (iVar7.current == this->entries + this->num_slots_minus_one + (long)this->max_lookups) {
    bVar21 = true;
    this_01 = (MethodPrototypeSymbol *)0x0;
  }
  else {
    this_01 = (MethodPrototypeSymbol *)((iVar7.current)->field_1).value.second;
    bVar21 = true;
    bVar20 = true;
    if ((local_124.m_bits & 2) == 0) {
      if (((SVar15 != (SourceLocation)0x0) &&
          (SVar3 = (SourceLocation)(this_01->super_Symbol).parentScope, SVar3 != (SourceLocation)0x0
          )) && (SVar3 != SVar15)) goto LAB_00263992;
      bVar20 = (this_01->super_Symbol).indexInScope < SVar16;
      if (bVar20) goto LAB_0026330f;
      SVar1 = (this_01->super_Symbol).kind;
      pSVar9 = (Scope *)0x0;
      if ((int)SVar1 < 0x41) {
        if (SVar1 == ClassType) {
          pSVar9 = *(Scope **)&(this_01->declaredReturnType).flags;
          goto LAB_002632d4;
        }
        if (SVar1 == TypeAlias) {
          pSVar9 = (Scope *)(this_01->declaredReturnType).initializer;
          goto LAB_002632d4;
        }
        if (SVar1 != Subroutine) goto LAB_002632d4;
LAB_0026324c:
        uVar2 = *(uint *)&(this_01->declaredReturnType).field_0x3c;
        if ((uVar2 >> 0x1e & 1) == 0) {
          pTVar8 = DeclaredType::getType(&this_01->declaredReturnType);
          if (pTVar8->canonical == (Type *)0x0) {
            Type::resolveCanonical(pTVar8);
          }
          bVar20 = (pTVar8->canonical->super_Symbol).kind == VoidType;
        }
        else {
          unqualifiedImpl::anon_class_32_4_2e62d3a1::operator()(&local_a0,(Symbol *)this_01);
        }
        bVar4 = false;
        if ((uVar2 >> 0x1e & 1) == 0) {
          pSVar9 = (Scope *)0x0;
          goto LAB_002632d4;
        }
      }
      else {
        if (SVar1 - Sequence < 2) {
          bVar20 = true;
          pSVar9 = (Scope *)0x0;
        }
        else if (SVar1 == GenericClassDef) {
          pSVar9 = this_01[2].super_Symbol.parentScope;
        }
        else if (SVar1 == MethodPrototype) goto LAB_0026324c;
LAB_002632d4:
        bVar4 = true;
        if (pSVar9 != (Scope *)0x0) {
          if (((SVar15 != (SourceLocation)0x0) &&
              (SVar3 = ((SourceRange *)&pSVar9->lastMember)->startLoc, SVar3 != (SourceLocation)0x0)
              ) && (SVar3 != SVar15)) {
LAB_00263992:
            assert::assertFailed
                      ("scope == other.scope || !scope || !other.scope",
                       "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Lookup.cpp"
                       ,0x34,
                       "bool slang::ast::LookupLocation::operator<(const LookupLocation &) const");
          }
          bVar20 = *(SymbolIndex *)&pSVar9[1].compilation < SVar16;
          result->fromForwardTypedef = true;
        }
      }
      if (bVar4) goto LAB_0026330f;
    }
    else {
LAB_0026330f:
      if (!bVar20) goto LAB_002633ee;
      for (; SVar1 = (this_01->super_Symbol).kind, SVar1 == TransparentMember;
          this_01 = (MethodPrototypeSymbol *)(this_01->super_Scope).compilation) {
      }
      if ((int)SVar1 < 0x31) {
        if (SVar1 != ForwardingTypedef) {
          if (SVar1 != ModportClocking) goto LAB_00263352;
          pSVar10 = (SubroutineSymbol *)(this_01->super_Scope).compilation;
LAB_0026334c:
          result->found = &pSVar10->super_Symbol;
        }
      }
      else if (SVar1 == ExplicitImport) {
        pSVar14 = ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)this_01);
        result->found = pSVar14;
        result->wasImported = true;
      }
      else {
        if (SVar1 == MethodPrototype) {
          pSVar10 = MethodPrototypeSymbol::getSubroutine(this_01);
          goto LAB_0026334c;
        }
LAB_00263352:
        result->found = &this_01->super_Symbol;
      }
      if (((result->found != (Symbol *)0x0) &&
          (pDVar11 = Symbol::getDeclaredType(result->found), pDVar11 != (DeclaredType *)0x0)) &&
         ((pDVar11->field_0x3f & 0x40) != 0)) {
        if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
          pSVar14 = result->found;
          range.endLoc = sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload
                         .super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.
                         endLoc;
          range.startLoc =
               sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
          pDVar12 = Diagnostics::add(&result->diagnostics,scope->thisSym,(DiagCode)0x23000a,range);
          arg._M_str = local_138._M_str;
          arg._M_len = local_138._M_len;
          Diagnostic::operator<<(pDVar12,arg);
          Diagnostic::addNote(pDVar12,(DiagCode)0x40001,pSVar14->location);
        }
        result->found = (Symbol *)0x0;
      }
    }
    bVar21 = false;
  }
LAB_002633ee:
  if (!bVar21) {
    return;
  }
  sVar22 = Scope::getWildcardImports(scope);
  local_a8 = sVar22.data_;
  if (sVar22.size_ == 0) {
LAB_002637d0:
    pSVar14 = scope->thisSym;
    pSVar9 = pSVar14->parentScope;
    if (pSVar9 != (Scope *)0x0) {
      SVar16 = pSVar14->indexInScope + 1;
      SVar1 = pSVar14->kind;
      if (SVar1 == ConstraintBlock) {
        outOfBlockIndex_00 = (SymbolIndex)pSVar14[2].name._M_len;
        outOfBlockIndex = SVar16;
      }
      else if (SVar1 == Subroutine) {
        outOfBlockIndex_00 = pSVar14[3].kind;
        outOfBlockIndex = SVar16;
      }
      else {
        outOfBlockIndex_00 = 0;
        if ((outOfBlockIndex == 0) && (outOfBlockIndex = SVar16, SVar1 == ClassType)) {
          if (pSVar14[1].indexInScope != 0) {
            Scope::elaborate((Scope *)&pSVar14[1].name);
          }
          pTVar8 = (Type *)pSVar14[2].name._M_len;
          outOfBlockIndex_00 = 0;
          if (pTVar8 == (Type *)0x0) {
            bVar21 = false;
          }
          else {
            if (pTVar8->canonical == (Type *)0x0) {
              Type::resolveCanonical(pTVar8);
            }
            bVar21 = (pTVar8->canonical->super_Symbol).kind == ErrorType;
          }
          result->suppressUndeclared = (bool)(result->suppressUndeclared | bVar21);
        }
      }
      name_00._M_str = local_138._M_str;
      name_00._M_len = local_138._M_len;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._17_7_ =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._17_7_;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_engaged;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
      sourceRange_00.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
      location_00.index = outOfBlockIndex;
      location_00.scope = pSVar9;
      location_00._12_4_ = 0;
      unqualifiedImpl(pSVar9,name_00,location_00,sourceRange_00,local_124,outOfBlockIndex_00,result)
      ;
    }
    return;
  }
  local_108 = local_f0;
  local_100 = 0;
  local_f8 = 4;
  local_80.ptr = (sherwood_v3_entry<const_slang::ast::Symbol_*> *)&local_80;
  local_120 = scope;
  local_58.super_StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>.
  storage = (StackAllocStorage<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL> *)
            local_80.ptr;
  local_58.entries = ska::detailv3::empty_default_table<slang::ast::Symbol_const*>();
  lVar18 = 0;
  local_58.num_slots_minus_one = 0;
  local_58.hash_policy.shift = '?';
  local_58.max_lookups = '\x03';
  local_58._max_load_factor = 0.5;
  local_58.num_elements = 0;
  local_118 = this_01;
  do {
    this_00 = *(WildcardImportSymbol **)((long)local_a8 + lVar18);
    SVar3 = (SourceLocation)(this_00->super_Symbol).parentScope;
    if (((SVar3 != (SourceLocation)0x0) && (SVar15 != (SourceLocation)0x0)) && (SVar3 != SVar15)) {
      assert::assertFailed
                ("scope == other.scope || !scope || !other.scope",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/ast/Lookup.cpp"
                 ,0x34,"bool slang::ast::LookupLocation::operator<(const LookupLocation &) const");
    }
    iVar6 = 6;
    if ((this_00->super_Symbol).indexInScope + 1 <= SVar16) {
      pPVar13 = WildcardImportSymbol::getPackage(this_00);
      if (pPVar13 == (PackageSymbol *)0x0) {
        result->suppressUndeclared = true;
        iVar6 = 7;
      }
      else {
        lookupName._M_str = local_138._M_str;
        lookupName._M_len = local_138._M_len;
        local_110 = PackageSymbol::findForImport(pPVar13,lookupName);
        if ((local_110 != (Symbol *)0x0) &&
           (pVar23 = ska::detailv3::
                     sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>>
                     ::emplace<slang::ast::Symbol_const*&>
                               ((sherwood_v3_table<slang::ast::Symbol_const*,slang::ast::Symbol_const*,std::hash<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<unsigned_long,std::hash<slang::ast::Symbol_const*>>,std::equal_to<slang::ast::Symbol_const*>,ska::detailv3::functor_storage<bool,std::equal_to<slang::ast::Symbol_const*>>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>,slang::StackAllocator<ska::detailv3::sherwood_v3_entry<slang::ast::Symbol_const*>,2ul>>
                                 *)&local_58,&local_110), uVar5 = local_100,
           ((undefined1  [16])pVar23 & (undefined1  [16])0x1) != (undefined1  [16])0x0)) {
          plVar17 = local_108 + local_100 * 2;
          if (local_100 == local_f8) {
            local_b0 = local_110;
            if (local_100 == 0x7fffffffffffffff) {
              detail::throwLengthError();
            }
            capacity = local_100 + 1;
            if (local_100 + 1 < local_f8 * 2) {
              capacity = local_f8 * 2;
            }
            if (0x7fffffffffffffff - local_f8 < local_f8) {
              capacity = 0x7fffffffffffffff;
            }
            __dest = (long *)detail::allocArray(capacity,0x10);
            __dest[uVar5 * 2] = (long)local_b0;
            __dest[uVar5 * 2 + 1] = (long)this_00;
            __n = local_100 * 0x10;
            if (local_108 + local_100 * 2 == plVar17) {
              plVar17 = local_108;
              __dest_00 = __dest;
              if (local_100 != 0) goto LAB_0026360f;
            }
            else {
              if (local_108 != plVar17) {
                memmove(__dest,local_108,(long)plVar17 - (long)local_108);
              }
              __n = (long)local_108 + (local_100 * 0x10 - (long)plVar17);
              if (__n != 0) {
                __dest_00 = __dest + uVar5 * 2 + 2;
LAB_0026360f:
                memmove(__dest_00,plVar17,__n);
              }
            }
            if (local_108 != local_f0) {
              free(local_108);
            }
            local_100 = local_100 + 1;
            this_01 = local_118;
            local_108 = __dest;
            local_f8 = capacity;
          }
          else {
            *plVar17 = (long)local_110;
            plVar17[1] = (long)this_00;
            local_100 = local_100 + 1;
            this_01 = local_118;
            if (local_100 == 0) {
              assert::assertFailed
                        ("len",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                         ,0x62,"reference slang::SmallVectorBase<Import>::back() [T = Import]");
            }
          }
        }
        iVar6 = 0;
      }
    }
    pSVar9 = local_120;
  } while (((iVar6 == 7) || (iVar6 == 0)) && (lVar18 = lVar18 + 8, sVar22.size_ << 3 != lVar18));
  if (local_100 == 0) {
    ska::detailv3::
    sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
    ::~sherwood_v3_table(&local_58);
    scope = local_120;
    if (local_108 != local_f0) {
      free(local_108);
    }
    goto LAB_002637d0;
  }
  if (local_100 != 1) {
    if (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
        super__Optional_payload_base<slang::SourceRange>._M_engaged == true) {
      range_01.endLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
      range_01.startLoc =
           sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
      pDVar12 = Diagnostics::add(&result->diagnostics,local_120->thisSym,(DiagCode)0xa,range_01);
      arg_01._M_str = local_138._M_str;
      arg_01._M_len = local_138._M_len;
      Diagnostic::operator<<(pDVar12,arg_01);
      plVar17 = local_108;
      if (local_100 != 0) {
        lVar19 = local_100 << 4;
        lVar18 = 0;
        do {
          Diagnostic::addNote(pDVar12,(DiagCode)0x39000a,
                              *(SourceLocation *)(*(long *)((long)plVar17 + lVar18 + 8) + 0x18));
          Diagnostic::addNote(pDVar12,(DiagCode)0x40001,
                              *(SourceLocation *)(*(long *)((long)plVar17 + lVar18) + 0x18));
          lVar18 = lVar18 + 0x10;
        } while (lVar19 != lVar18);
      }
    }
    goto LAB_00263894;
  }
  if ((this_01 != (MethodPrototypeSymbol *)0x0) &&
     (sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
      super__Optional_payload_base<slang::SourceRange>._M_engaged == true)) {
    if ((this_01->super_Symbol).kind == ExplicitImport) {
      pSVar14 = ExplicitImportSymbol::importedSymbol((ExplicitImportSymbol *)this_01);
      if (local_100 == 0) goto LAB_002639d5;
      if (pSVar14 == (Symbol *)*local_108) goto LAB_0026375c;
    }
    range_00.endLoc =
         sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.endLoc;
    range_00.startLoc =
         sourceRange.super__Optional_base<slang::SourceRange,_true,_true>._M_payload.
         super__Optional_payload_base<slang::SourceRange>._M_payload._M_value.startLoc;
    pDVar12 = Diagnostics::add(&result->diagnostics,pSVar9->thisSym,(DiagCode)0xb000a,range_00);
    arg_00._M_str = local_138._M_str;
    arg_00._M_len = local_138._M_len;
    Diagnostic::operator<<(pDVar12,arg_00);
    Diagnostic::addNote(pDVar12,(DiagCode)0x40001,(this_01->super_Symbol).location);
    if ((local_100 == 0) ||
       (Diagnostic::addNote(pDVar12,(DiagCode)0x39000a,*(SourceLocation *)(local_108[1] + 0x18)),
       local_100 == 0)) {
      assert::assertFailed
                ("index < len",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
                 ,0x196,
                 "reference slang::SmallVectorBase<Import>::operator[](size_type) [T = Import]");
    }
    Diagnostic::addNote(pDVar12,(DiagCode)0x40001,*(SourceLocation *)(*local_108 + 0x18));
  }
LAB_0026375c:
  result->wasImported = true;
  if (local_100 == 0) {
LAB_002639d5:
    assert::assertFailed
              ("index < len",
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/SmallVector.h"
               ,0x196,"reference slang::SmallVectorBase<Import>::operator[](size_type) [T = Import]"
              );
  }
  result->found = (Symbol *)*local_108;
  do {
    pPVar13 = (PackageSymbol *)pSVar9->thisSym;
    if ((pPVar13->super_Symbol).kind == Package) {
      PackageSymbol::noteImport(pPVar13,result->found);
      break;
    }
    pSVar9 = (pPVar13->super_Symbol).parentScope;
  } while (pSVar9 != (Scope *)0x0);
LAB_00263894:
  ska::detailv3::
  sherwood_v3_table<const_slang::ast::Symbol_*,_const_slang::ast::Symbol_*,_std::hash<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<unsigned_long,_std::hash<const_slang::ast::Symbol_*>_>,_std::equal_to<const_slang::ast::Symbol_*>,_ska::detailv3::functor_storage<bool,_std::equal_to<const_slang::ast::Symbol_*>_>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>,_slang::StackAllocator<ska::detailv3::sherwood_v3_entry<const_slang::ast::Symbol_*>,_2UL>_>
  ::~sherwood_v3_table(&local_58);
  if (local_108 == local_f0) {
    return;
  }
  free(local_108);
  return;
}

Assistant:

void Lookup::unqualifiedImpl(const Scope& scope, string_view name, LookupLocation location,
                             std::optional<SourceRange> sourceRange, bitmask<LookupFlags> flags,
                             SymbolIndex outOfBlockIndex, LookupResult& result) {
    auto reportRecursiveError = [&](const Symbol& symbol) {
        if (sourceRange) {
            auto& diag = result.addDiag(scope, diag::RecursiveDefinition, *sourceRange);
            diag << name;
            diag.addNote(diag::NoteDeclarationHere, symbol.location);
        }
        result.found = nullptr;
    };

    // Try a simple name lookup to see if we find anything.
    auto& nameMap = scope.getNameMap();
    const Symbol* symbol = nullptr;
    if (auto it = nameMap.find(name); it != nameMap.end()) {
        // If the lookup is for a local name, check that we can access the symbol (it must be
        // declared before use). Callables and block names can be referenced anywhere in the
        // scope, so the location doesn't matter for them.
        symbol = it->second;
        bool locationGood = true;
        if (!flags.has(LookupFlags::AllowDeclaredAfter)) {
            locationGood = LookupLocation::before(*symbol) < location;
            if (!locationGood) {
                // A type alias can have forward definitions, so check those locations as well.
                // The forward decls form a linked list that are always ordered by location,
                // so we only need to check the first one.
                const ForwardingTypedefSymbol* forward = nullptr;
                switch (symbol->kind) {
                    case SymbolKind::TypeAlias:
                        forward = symbol->as<TypeAliasType>().getFirstForwardDecl();
                        break;
                    case SymbolKind::ClassType:
                        forward = symbol->as<ClassType>().getFirstForwardDecl();
                        break;
                    case SymbolKind::GenericClassDef:
                        forward = symbol->as<GenericClassDefSymbol>().getFirstForwardDecl();
                        break;
                    case SymbolKind::Subroutine: {
                        // Subroutines can be referenced before they are declared if they
                        // are tasks or return void (tasks are always set to have a void
                        // return type internally so we only need one check here).
                        //
                        // It's important to check that we're not in the middle of evaluating
                        // the return type before we try to access that return type or
                        // we'll hard fail.
                        auto& sub = symbol->as<SubroutineSymbol>();
                        if (sub.declaredReturnType.isEvaluating()) {
                            reportRecursiveError(*symbol);
                            return;
                        }

                        locationGood = sub.getReturnType().isVoid();
                        break;
                    }
                    case SymbolKind::MethodPrototype: {
                        // Same as above.
                        auto& sub = symbol->as<MethodPrototypeSymbol>();
                        if (sub.declaredReturnType.isEvaluating()) {
                            reportRecursiveError(*symbol);
                            return;
                        }

                        locationGood = sub.getReturnType().isVoid();
                        break;
                    }
                    case SymbolKind::Sequence:
                    case SymbolKind::Property:
                        // Sequences and properties can always be referenced before declaration.
                        locationGood = true;
                        break;
                    default:
                        break;
                }

                if (forward) {
                    locationGood = LookupLocation::before(*forward) < location;
                    result.fromForwardTypedef = true;
                }
            }
        }

        if (locationGood) {
            // Unwrap the symbol if it's hidden behind an import or hoisted enum member.
            while (symbol->kind == SymbolKind::TransparentMember)
                symbol = &symbol->as<TransparentMemberSymbol>().wrapped;

            switch (symbol->kind) {
                case SymbolKind::ExplicitImport:
                    result.found = symbol->as<ExplicitImportSymbol>().importedSymbol();
                    result.wasImported = true;
                    break;
                case SymbolKind::ForwardingTypedef:
                    // If we find a forwarding typedef, the actual typedef was never defined.
                    // Just ignore it, we'll issue a better error later.
                    break;
                case SymbolKind::MethodPrototype:
                    // Looking up a prototype should always forward on to the actual method.
                    result.found = symbol->as<MethodPrototypeSymbol>().getSubroutine();
                    break;
                case SymbolKind::ModportClocking:
                    result.found = symbol->as<ModportClockingSymbol>().target;
                    break;
                default:
                    result.found = symbol;
                    break;
            }

            // We have a fully resolved and valid symbol. Before we return back to the caller,
            // make sure that the symbol we're returning isn't in the process of having its type
            // evaluated. This can only happen with a mutually recursive definition of something
            // like a parameter and a function, so detect and report the error here to avoid a
            // stack overflow.
            if (result.found) {
                auto declaredType = result.found->getDeclaredType();
                if (declaredType && declaredType->isEvaluating())
                    reportRecursiveError(*result.found);
            }

            return;
        }
    }

    // Look through any wildcard imports prior to the lookup point and see if their packages
    // contain the name we're looking for.
    auto wildcardImports = scope.getWildcardImports();
    if (!wildcardImports.empty()) {
        struct Import {
            const Symbol* imported;
            const WildcardImportSymbol* import;
        };
        SmallVector<Import, 4> imports;
        SmallSet<const Symbol*, 2> importDedup;

        for (auto import : wildcardImports) {
            if (location < LookupLocation::after(*import))
                break;

            auto package = import->getPackage();
            if (!package) {
                result.suppressUndeclared = true;
                continue;
            }

            const Symbol* imported = package->findForImport(name);
            if (imported && importDedup.emplace(imported).second)
                imports.emplace_back(Import{imported, import});
        }

        if (!imports.empty()) {
            if (imports.size() > 1) {
                if (sourceRange) {
                    auto& diag = result.addDiag(scope, diag::AmbiguousWildcardImport, *sourceRange);
                    diag << name;
                    for (const auto& pair : imports) {
                        diag.addNote(diag::NoteImportedFrom, pair.import->location);
                        diag.addNote(diag::NoteDeclarationHere, pair.imported->location);
                    }
                }
                return;
            }

            if (symbol && sourceRange) {
                // The existing symbol might be an import for the thing we just imported
                // via wildcard, which is fine so don't error for that case.
                if (symbol->kind != SymbolKind::ExplicitImport ||
                    symbol->as<ExplicitImportSymbol>().importedSymbol() != imports[0].imported) {

                    auto& diag = result.addDiag(scope, diag::ImportNameCollision, *sourceRange);
                    diag << name;
                    diag.addNote(diag::NoteDeclarationHere, symbol->location);
                    diag.addNote(diag::NoteImportedFrom, imports[0].import->location);
                    diag.addNote(diag::NoteDeclarationHere, imports[0].imported->location);
                }
            }

            result.wasImported = true;
            result.found = imports[0].imported;

            // If we are doing this lookup from a scope that is within a package declaration
            // we should note that fact so that it can later be exported if desired.
            auto currScope = &scope;
            do {
                auto& sym = currScope->asSymbol();
                if (sym.kind == SymbolKind::Package) {
                    sym.as<PackageSymbol>().noteImport(*result.found);
                    break;
                }

                currScope = sym.getParentScope();
            } while (currScope);

            return;
        }
    }

    // Continue up the scope chain via our parent.
    location = LookupLocation::after(scope.asSymbol());
    if (!location.getScope())
        return;

    // If this scope was an out-of-block subroutine, tell the next recursive call about it.
    // Otherwise, if our previous call was for such a situation and we didn't find the symbol
    // in this class scope, we need to use the subroutine's out-of-block lookup location
    // instead in order to properly handle cases like:
    //   class C;
    //     extern function int foo;
    //   endclass
    //   localparam int k = ...;
    //   function int C::foo;
    //     return k;
    //   endfunction
    auto& sym = scope.asSymbol();
    if (sym.kind == SymbolKind::Subroutine) {
        outOfBlockIndex = sym.as<SubroutineSymbol>().outOfBlockIndex;
    }
    else if (sym.kind == SymbolKind::ConstraintBlock) {
        outOfBlockIndex = sym.as<ConstraintBlockSymbol>().getOutOfBlockIndex();
    }
    else if (uint32_t(outOfBlockIndex) != 0) {
        location = LookupLocation(location.getScope(), uint32_t(outOfBlockIndex));
        outOfBlockIndex = SymbolIndex(0);
    }
    else if (sym.kind == SymbolKind::ClassType) {
        // Suppress errors when we fail to find a symbol inside a class that
        // had a problem resolving its base class, since the symbol may be
        // expected to be defined in the base.
        auto baseClass = sym.as<ClassType>().getBaseClass();
        result.suppressUndeclared |= baseClass && baseClass->isError();
    }

    return unqualifiedImpl(*location.getScope(), name, location, sourceRange, flags,
                           outOfBlockIndex, result);
}